

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::BeginRenderPass
          (DeviceContextGLImpl *this,BeginRenderPassAttribs *Attribs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pOVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  Uint32 i;
  char *Args_1;
  string msg;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs);
  std::vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>::resize
            (&this->m_AttachmentClearValues,(ulong)Attribs->ClearValueCount);
  lVar7 = 0;
  for (Args_1 = (char *)0x0; Args_1 < (char (*) [20])(ulong)Attribs->ClearValueCount;
      Args_1 = Args_1 + 1) {
    pOVar3 = (this->m_AttachmentClearValues).
             super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)((long)Attribs->pClearValues->Color + lVar7 + -4);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)Attribs->pClearValues->Color + lVar7 + 8);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)pOVar3->Color + lVar7 + 8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    puVar1 = (undefined8 *)((long)pOVar3->Color + lVar7 + -4);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    lVar7 = lVar7 + 0x1c;
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pBoundFramebuffer",
               (char (*) [20])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x28d);
    std::__cxx11::string::~string((string *)&msg);
  }
  SetViewports(this,1,(Viewport *)0x0,0,0);
  BeginSubpass(this);
  return;
}

Assistant:

void DeviceContextGLImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    m_AttachmentClearValues.resize(Attribs.ClearValueCount);
    for (Uint32 i = 0; i < Attribs.ClearValueCount; ++i)
        m_AttachmentClearValues[i] = Attribs.pClearValues[i];

    VERIFY_EXPR(m_pBoundFramebuffer);

    SetViewports(1, nullptr, 0, 0);

    BeginSubpass();
}